

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

size_t __thiscall
anon_unknown.dwarf_2b0a42::t_debugger::f_read_integer(t_debugger *this,wint_t *a_c)

{
  int iVar1;
  wint_t wVar2;
  undefined8 local_20;
  size_t i;
  wint_t *a_c_local;
  t_debugger *this_local;
  
  local_20 = 0;
  while( true ) {
    iVar1 = iswdigit(*a_c);
    if (iVar1 == 0) break;
    local_20 = local_20 * 10 + (ulong)(*a_c - 0x30);
    wVar2 = getwchar();
    *a_c = wVar2;
  }
  return local_20;
}

Assistant:

size_t f_read_integer(wint_t& a_c)
	{
		size_t i = 0;
		while (std::iswdigit(a_c)) {
			i = i * 10 + (a_c - L'0');
			a_c = std::getwchar();
		}
		return i;
	}